

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O0

void cpu_ppc_set_tb_clk(void *opaque,uint32_t freq)

{
  long lVar1;
  ArchCPU_conflict18 *cpu_00;
  ppc_tb_t *tb_env;
  PowerPCCPU_conflict3 *cpu;
  CPUPPCState_conflict2 *env;
  uint32_t freq_local;
  void *opaque_local;
  
  cpu_00 = env_archcpu((CPUArchState_conflict21 *)opaque);
  lVar1 = *(long *)((long)opaque + 0x12f58);
  *(uint32_t *)(lVar1 + 0x18) = freq;
  *(uint32_t *)(lVar1 + 0x28) = freq;
  _cpu_ppc_store_decr(cpu_00,0xffffffff,0xffffffff,0x20);
  _cpu_ppc_store_hdecr(cpu_00,0xffffffff,0xffffffff,0x20);
  cpu_ppc_store_purr_ppc64((CPUPPCState_conflict2 *)opaque,0);
  return;
}

Assistant:

static void cpu_ppc_set_tb_clk (void *opaque, uint32_t freq)
{
    CPUPPCState *env = opaque;
    PowerPCCPU *cpu = env_archcpu(env);
    ppc_tb_t *tb_env = env->tb_env;

    tb_env->tb_freq = freq;
    tb_env->decr_freq = freq;
    /* There is a bug in Linux 2.4 kernels:
     * if a decrementer exception is pending when it enables msr_ee at startup,
     * it's not ready to handle it...
     */
    _cpu_ppc_store_decr(cpu, 0xFFFFFFFF, 0xFFFFFFFF, 32);
    _cpu_ppc_store_hdecr(cpu, 0xFFFFFFFF, 0xFFFFFFFF, 32);
    cpu_ppc_store_purr(env, 0x0000000000000000ULL);
}